

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * Lowerer::LoadFloatFromNonReg(Opnd *opndSrc,Opnd *opndDst,Instr *instrInsert)

{
  IRType IVar1;
  code *pcVar2;
  OpndKind OVar3;
  OpndKind OVar4;
  bool bVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  _func_int **pp_Var8;
  
  OVar3 = IR::Opnd::GetKind(opndSrc);
  OVar4 = IR::Opnd::GetKind(opndSrc);
  if (OVar3 == OpndKindAddr) {
    if (OVar4 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar5) goto LAB_005b1860;
      *puVar6 = 0;
    }
    pp_Var8 = opndSrc[2]._vptr_Opnd;
    if (((ulong)pp_Var8 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pp_Var8 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pp_Var8 & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)pp_Var8 >> 0x32 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Library/JavascriptNumber.h"
                             ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'");
          if (!bVar5) goto LAB_005b1860;
          *puVar6 = 0;
        }
        pp_Var8 = (_func_int **)((ulong)pp_Var8 ^ 0xfffc000000000000);
        goto LAB_005b184d;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_005b1860;
      *puVar6 = 0;
    }
    pp_Var8 = (_func_int **)(double)(int)pp_Var8;
  }
  else if (OVar4 == OpndKindIntConst) {
    IVar1 = opndSrc->m_type;
    OVar3 = IR::Opnd::GetKind(opndSrc);
    if (IVar1 == TyUint32) {
      if (OVar3 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar5) goto LAB_005b1860;
        *puVar6 = 0;
      }
      pp_Var8 = (_func_int **)(double)*(uint *)&opndSrc[1]._vptr_Opnd;
    }
    else {
      if (OVar3 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar5) goto LAB_005b1860;
        *puVar6 = 0;
      }
      pp_Var8 = (_func_int **)(double)(long)opndSrc[1]._vptr_Opnd;
    }
  }
  else {
    OVar3 = IR::Opnd::GetKind(opndSrc);
    OVar4 = IR::Opnd::GetKind(opndSrc);
    if (OVar3 == OpndKindFloatConst) {
      if (OVar4 != OpndKindFloatConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x107,"(this->IsFloatConstOpnd())","Bad call to AsFloatConstOpnd()");
        if (!bVar5) goto LAB_005b1860;
        *puVar6 = 0;
      }
      pp_Var8 = opndSrc[1]._vptr_Opnd;
    }
    else {
      if (OVar4 == OpndKindFloat32Const) {
        OVar3 = IR::Opnd::GetKind(opndSrc);
        if (OVar3 != OpndKindFloat32Const) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,299,"(this->IsFloat32ConstOpnd())","Bad call to AsFloat32ConstOpnd()")
          ;
          if (!bVar5) goto LAB_005b1860;
          *puVar6 = 0;
        }
        pIVar7 = LowererMD::LoadFloatValue<float>
                           (opndDst,*(float *)&opndSrc[1]._vptr_Opnd,instrInsert);
        return pIVar7;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x398f,"(0)","Unexpected opnd type");
      if (!bVar5) {
LAB_005b1860:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
      pp_Var8 = (_func_int **)0x0;
    }
  }
LAB_005b184d:
  pIVar7 = LowererMD::LoadFloatValue<double>(opndDst,(double)pp_Var8,instrInsert);
  return pIVar7;
}

Assistant:

IR::Instr *
Lowerer::LoadFloatFromNonReg(IR::Opnd * opndSrc, IR::Opnd * opndDst, IR::Instr * instrInsert)
{
    double value;

    if (opndSrc->IsAddrOpnd())
    {
        Js::Var var = opndSrc->AsAddrOpnd()->m_address;
        if (Js::TaggedInt::Is(var))
        {
            value = Js::TaggedInt::ToDouble(var);
        }
        else
        {
            value = Js::JavascriptNumber::GetValue(var);
        }
    }
    else if (opndSrc->IsIntConstOpnd())
    {
        if (opndSrc->IsUInt32())
        {
            value = (double)(uint32)opndSrc->AsIntConstOpnd()->GetValue();
        }
        else
        {
            value = (double)opndSrc->AsIntConstOpnd()->GetValue();
        }
    }
    else if (opndSrc->IsFloatConstOpnd())
    {
        value = (double)opndSrc->AsFloatConstOpnd()->m_value;
    }
    else if (opndSrc->IsFloat32ConstOpnd())
    {
        float floatValue = opndSrc->AsFloat32ConstOpnd()->m_value;
        return LowererMD::LoadFloatValue(opndDst, floatValue, instrInsert);
    }
    else
    {
        AssertMsg(0, "Unexpected opnd type");
        value = 0;
    }

    return LowererMD::LoadFloatValue(opndDst, value, instrInsert);
}